

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

void __thiscall boost::runtime::cla::parser::usage(parser *this,ostream *ostr,cstring *param_name)

{
  bool bVar1;
  type s;
  ulong uVar2;
  ostream *poVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  basic_cstring<const_char> *in_RDX;
  basic_cstring<const_char> *in_RSI;
  long in_RDI;
  basic_param_ptr param;
  cstring *in_stack_00000618;
  cstring *in_stack_00000620;
  trie_ptr *in_stack_00000628;
  parser *in_stack_00000630;
  shared_ptr<boost::runtime::basic_param> *in_stack_fffffffffffffed8;
  shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *in_stack_fffffffffffffee0;
  pair<boost::runtime::parameter_cla_id,_boost::shared_ptr<boost::runtime::basic_param>_> *this_00;
  undefined8 uVar5;
  basic_cstring<const_char> *s_00;
  undefined1 local_f0 [8];
  key_type *in_stack_ffffffffffffff18;
  map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
  *in_stack_ffffffffffffff20;
  basic_cstring<const_char> *in_stack_ffffffffffffff38;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_ffffffffffffff40;
  undefined8 local_10;
  
  s_00 = in_RDX;
  local_10 = in_RSI;
  bVar1 = unit_test::basic_cstring<const_char>::is_empty(in_RDX);
  if (bVar1) {
    std::operator<<((ostream *)local_10,"Usage: ");
    pbVar4 = unit_test::operator<<(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    std::operator<<(pbVar4," [Boost.Test argument]... ");
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      poVar3 = std::operator<<((ostream *)local_10,(string *)(in_RDI + 0x10));
      std::operator<<(poVar3," [custom test module argument]...");
    }
    std::operator<<((ostream *)local_10,"\n");
  }
  else {
    std::
    map<boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>_>_>_>
    ::operator[](in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::shared_ptr
              (in_stack_fffffffffffffee0,
               (shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)
               in_stack_fffffffffffffed8);
    unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)&stack0xffffffffffffff40,s_00);
    unit_test::basic_cstring<const_char>::basic_cstring(s_00,(pointer)in_RDX);
    locate_parameter(in_stack_00000630,in_stack_00000628,in_stack_00000620,in_stack_00000618);
    this_00 = (pair<boost::runtime::parameter_cla_id,_boost::shared_ptr<boost::runtime::basic_param>_>
               *)&stack0xffffffffffffffd8;
    shared_ptr<boost::runtime::basic_param>::shared_ptr
              ((shared_ptr<boost::runtime::basic_param> *)this_00,in_stack_fffffffffffffed8);
    std::pair<boost::runtime::parameter_cla_id,_boost::shared_ptr<boost::runtime::basic_param>_>::
    ~pair(this_00);
    shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie>::~shared_ptr
              ((shared_ptr<boost::runtime::cla::rt_cla_detail::parameter_trie> *)0x245e45);
    s = shared_ptr<boost::runtime::basic_param>::operator->
                  ((shared_ptr<boost::runtime::basic_param> *)this_00);
    uVar5 = local_10;
    unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)local_10,(std_string *)s);
    (*s->_vptr_basic_param[5])(s,uVar5,local_f0);
    shared_ptr<boost::runtime::basic_param>::~shared_ptr
              ((shared_ptr<boost::runtime::basic_param> *)0x245e9d);
  }
  poVar3 = std::operator<<((ostream *)local_10,"\nFor detailed help on Boost.Test parameters use:\n"
                          );
  std::operator<<(poVar3,"  ");
  pbVar4 = unit_test::operator<<(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  poVar3 = std::operator<<(pbVar4," --help\n");
  poVar3 = std::operator<<(poVar3,"or\n");
  std::operator<<(poVar3,"  ");
  pbVar4 = unit_test::operator<<(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::operator<<(pbVar4," --help=<parameter name>\n");
  return;
}

Assistant:

void
    usage( std::ostream& ostr, cstring param_name = cstring() )
    {
        if( !param_name.is_empty() ) {
            basic_param_ptr param = locate_parameter( m_param_trie[help_prefix], param_name, "" ).second;
            param->usage( ostr, m_negation_prefix );
        }
        else {
            ostr << "Usage: " << m_program_name << " [Boost.Test argument]... ";
            if( !m_end_of_param_indicator.empty() )
                ostr << m_end_of_param_indicator << " [custom test module argument]...";
            ostr << "\n";
        }

        ostr << "\nFor detailed help on Boost.Test parameters use:\n"
             << "  " << m_program_name << " --help\n"
             << "or\n"
             << "  " << m_program_name << " --help=<parameter name>\n";
    }